

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall ftxui::ComponentBase::Active(ComponentBase *this)

{
  element_type *peVar1;
  bool bVar2;
  bool local_2a;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_28;
  ComponentBase *local_18;
  ComponentBase *this_local;
  
  bVar2 = this->parent_ != (ComponentBase *)0x0;
  local_2a = true;
  local_18 = this;
  if (bVar2) {
    (*this->parent_->_vptr_ComponentBase[4])(&local_28);
    peVar1 = std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::get(&local_28);
    local_2a = peVar1 == this;
  }
  this_local._7_1_ = local_2a;
  if (bVar2) {
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr
              ((shared_ptr<ftxui::ComponentBase> *)&local_28);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ComponentBase::Active() const {
  return !parent_ || parent_->ActiveChild().get() == this;
}